

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_value_blob(sqlite3_value *pVal)

{
  sqlite3_value *local_30;
  int local_24;
  Mem *p;
  sqlite3_value *pVal_local;
  
  if ((pVal->flags & 0x12) == 0) {
    pVal_local = (sqlite3_value *)sqlite3_value_text(pVal);
  }
  else {
    if ((pVal->flags & 0x400) == 0) {
      local_24 = 0;
    }
    else {
      local_24 = sqlite3VdbeMemExpandBlob(pVal);
    }
    if (local_24 == 0) {
      pVal->flags = pVal->flags | 0x10;
      if (pVal->n == 0) {
        local_30 = (sqlite3_value *)0x0;
      }
      else {
        local_30 = (sqlite3_value *)pVal->z;
      }
      pVal_local = local_30;
    }
    else {
      pVal_local = (sqlite3_value *)0x0;
    }
  }
  return pVal_local;
}

Assistant:

SQLITE_API const void *sqlite3_value_blob(sqlite3_value *pVal){
  Mem *p = (Mem*)pVal;
  if( p->flags & (MEM_Blob|MEM_Str) ){
    if( ExpandBlob(p)!=SQLITE_OK ){
      assert( p->flags==MEM_Null && p->z==0 );
      return 0;
    }
    p->flags |= MEM_Blob;
    return p->n ? p->z : 0;
  }else{
    return sqlite3_value_text(pVal);
  }
}